

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFraig(Abc_Ntk_t *pNtk,void *pParams,int fAllNodes,int fExdc)

{
  int iVar1;
  int iVar2;
  Fraig_Man_t *p;
  stmm_table *table;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *p_00;
  Abc_Ntk_t *pNtkNew;
  ulong uVar4;
  ProgressBar *p_01;
  Abc_Ntk_t *pAVar5;
  ulong uVar6;
  char *pString;
  uint nCapMin;
  char **local_48;
  Fraig_Man_t *local_40;
  Abc_Obj_t *pRepr;
  
  if (fExdc != 0) {
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) goto LAB_00239b01;
    puts("Warning: Networks has no EXDC.");
  }
  fExdc = 0;
LAB_00239b01:
  p = (Fraig_Man_t *)Abc_NtkToFraig(pNtk,pParams,fAllNodes,fExdc);
  if (*(int *)((long)pParams + 0x24) != 0) {
    Fraig_ManProveMiter(p);
  }
  if (fExdc == 0) {
    pNtkNew = Abc_NtkFromFraig(p,pNtk);
  }
  else {
    local_40 = p;
    table = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
    pAVar3 = Abc_AigConst1(pNtk);
    iVar1 = stmm_find_or_add(table,(char *)((ulong)(pAVar3->field_6).pTemp & 0xfffffffffffffffe),
                             &local_48);
    if (iVar1 == 0) {
      *local_48 = (char *)pAVar3;
    }
    for (iVar1 = 0; iVar1 < pNtk->vCis->nSize; iVar1 = iVar1 + 1) {
      pAVar3 = Abc_NtkCi(pNtk,iVar1);
      iVar2 = stmm_find_or_add(table,(char *)((ulong)(pAVar3->field_6).pTemp & 0xfffffffffffffffe),
                               &local_48);
      if (iVar2 == 0) {
        *local_48 = (char *)pAVar3;
      }
    }
    for (iVar1 = 0; iVar2 = pNtk->vObjs->nSize, iVar1 < iVar2; iVar1 = iVar1 + 1) {
      pAVar3 = Abc_NtkObj(pNtk,iVar1);
      if (((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
         ((pAVar3->field_6).pTemp != (void *)0x0)) {
        iVar2 = stmm_find_or_add(table,(char *)((ulong)(pAVar3->field_6).pTemp & 0xfffffffffffffffe)
                                 ,&local_48);
        if ((iVar2 == 0) ||
           (*(uint *)&pAVar3->field_0x14 >> 0xc < *(uint *)(*local_48 + 0x14) >> 0xc)) {
          *local_48 = (char *)pAVar3;
        }
      }
    }
    p_00 = Vec_PtrStart(iVar2);
    for (iVar1 = 0; iVar1 < pNtk->vObjs->nSize; iVar1 = iVar1 + 1) {
      pAVar3 = Abc_NtkObj(pNtk,iVar1);
      if (((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
         ((pAVar3->field_6).pTemp != (void *)0x0)) {
        iVar2 = stmm_lookup(table,(char *)((ulong)(pAVar3->field_6).pTemp & 0xfffffffffffffffe),
                            (char **)&pRepr);
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                        ,0x19a,"Abc_Ntk_t *Abc_NtkFromFraig2(Fraig_Man_t *, Abc_Ntk_t *)");
        }
        if (pAVar3 != pRepr) {
          Vec_PtrWriteEntry(p_00,pAVar3->Id,pRepr);
        }
      }
    }
    stmm_free_table(table);
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    Abc_AigSetNodePhases(pNtk);
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      nCapMin = pNtk->vObjs->nSize + 500;
      Vec_IntGrow(&pNtk->vTravIds,nCapMin);
      uVar4 = 0;
      uVar6 = 0;
      if (0 < (int)nCapMin) {
        uVar6 = (ulong)nCapMin;
      }
      for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        (pNtk->vTravIds).pArray[uVar4] = 0;
      }
      (pNtk->vTravIds).nSize = nCapMin;
    }
    iVar1 = pNtk->nTravIds;
    pNtk->nTravIds = iVar1 + 1;
    if (0x3ffffffe < iVar1) {
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                    ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    p_01 = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
    for (iVar1 = 0; iVar1 < pNtk->vCos->nSize; iVar1 = iVar1 + 1) {
      pAVar3 = Abc_NtkCo(pNtk,iVar1);
      Extra_ProgressBarUpdate(p_01,iVar1,pString);
      Abc_NtkFromFraig2_rec
                (pNtkNew,(Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray],p_00);
    }
    Extra_ProgressBarStop(p_01);
    Vec_PtrFree(p_00);
    Abc_NtkFinalize(pNtk,pNtkNew);
    p = local_40;
  }
  Fraig_ManFree(p);
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pAVar5 = Abc_NtkDup(pNtk->pExdc);
    pNtkNew->pExdc = pAVar5;
  }
  iVar1 = Abc_NtkCheck(pNtkNew);
  if (iVar1 == 0) {
    puts("Abc_NtkFraig: The network check has failed.");
    Abc_NtkDelete(pNtkNew);
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkFraig( Abc_Ntk_t * pNtk, void * pParams, int fAllNodes, int fExdc )
{
    Fraig_Params_t * pPars = (Fraig_Params_t *)pParams;
    Abc_Ntk_t * pNtkNew;
    Fraig_Man_t * pMan; 
    // check if EXDC is present
    if ( fExdc && pNtk->pExdc == NULL )
        fExdc = 0, printf( "Warning: Networks has no EXDC.\n" );
    // perform fraiging
    pMan = (Fraig_Man_t *)Abc_NtkToFraig( pNtk, pParams, fAllNodes, fExdc ); 
    // add algebraic choices
//    if ( pPars->fChoicing )
//        Fraig_ManAddChoices( pMan, 0, 6 );
    // prove the miter if asked to
    if ( pPars->fTryProve )
        Fraig_ManProveMiter( pMan );
    // reconstruct FRAIG in the new network
    if ( fExdc ) 
        pNtkNew = Abc_NtkFromFraig2( pMan, pNtk );
    else
        pNtkNew = Abc_NtkFromFraig( pMan, pNtk );
    Fraig_ManFree( pMan );
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkFraig: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}